

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_OverlapSequenceChecks::_Run(_Test_OverlapSequenceChecks *this)

{
  bool bVar1;
  Tester local_840;
  Tester local_6a0;
  Tester local_500;
  Tester local_360;
  Tester local_1b0;
  _Test_OverlapSequenceChecks *local_10;
  _Test_OverlapSequenceChecks *this_local;
  
  local_10 = this;
  FindFileTest::Add(&this->super_FindFileTest,"200","200",5000,3000);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
             ,0x97);
  bVar1 = FindFileTest::Overlaps(&this->super_FindFileTest,"199","199");
  test::Tester::Is(&local_1b0,(bool)(~bVar1 & 1),"!Overlaps(\"199\", \"199\")");
  test::Tester::~Tester(&local_1b0);
  test::Tester::Tester
            (&local_360,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
             ,0x98);
  bVar1 = FindFileTest::Overlaps(&this->super_FindFileTest,"201","300");
  test::Tester::Is(&local_360,(bool)(~bVar1 & 1),"!Overlaps(\"201\", \"300\")");
  test::Tester::~Tester(&local_360);
  test::Tester::Tester
            (&local_500,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
             ,0x99);
  bVar1 = FindFileTest::Overlaps(&this->super_FindFileTest,"200","200");
  test::Tester::Is(&local_500,bVar1,"Overlaps(\"200\", \"200\")");
  test::Tester::~Tester(&local_500);
  test::Tester::Tester
            (&local_6a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
             ,0x9a);
  bVar1 = FindFileTest::Overlaps(&this->super_FindFileTest,"190","200");
  test::Tester::Is(&local_6a0,bVar1,"Overlaps(\"190\", \"200\")");
  test::Tester::~Tester(&local_6a0);
  test::Tester::Tester
            (&local_840,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set_test.cc"
             ,0x9b);
  bVar1 = FindFileTest::Overlaps(&this->super_FindFileTest,"200","210");
  test::Tester::Is(&local_840,bVar1,"Overlaps(\"200\", \"210\")");
  test::Tester::~Tester(&local_840);
  return;
}

Assistant:

TEST(FindFileTest, OverlapSequenceChecks) {
  Add("200", "200", 5000, 3000);
  ASSERT_TRUE(!Overlaps("199", "199"));
  ASSERT_TRUE(!Overlaps("201", "300"));
  ASSERT_TRUE(Overlaps("200", "200"));
  ASSERT_TRUE(Overlaps("190", "200"));
  ASSERT_TRUE(Overlaps("200", "210"));
}